

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O0

void Gia_ManSetDefaultParamsSwi(Gia_ParSwi_t *p)

{
  Gia_ParSwi_t *p_local;
  
  memset(p,0,0x1c);
  p->nWords = 10;
  p->nIters = 0x30;
  p->nPref = 0x10;
  p->nRandPiFactor = 0;
  p->fProbOne = 0;
  p->fProbTrans = 1;
  p->fVerbose = 0;
  return;
}

Assistant:

void Gia_ManSetDefaultParamsSwi( Gia_ParSwi_t * p )
{
    memset( p, 0, sizeof(Gia_ParSwi_t) );
    p->nWords        =  10;  // the number of machine words of simulatation data 
    p->nIters        =  48;  // the number of all timeframes to simulate
    p->nPref         =  16;  // the number of first timeframes to skip when computing switching
    p->nRandPiFactor =   0;  // primary input transition probability (-1=3/8; 0=1/2; 1=1/4; 2=1/8, etc)
    p->fProbOne      =   0;  // compute probability of signal being one (if 0, compute probability of switching)
    p->fProbTrans    =   1;  // compute signal transition probability (if 0, compute transition probability using probability of being one)
    p->fVerbose      =   0;  // enables verbose output
}